

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInt.cpp
# Opt level: O1

BigInt * __thiscall BigInt::quick_pow(BigInt *__return_storage_ptr__,BigInt *this,int power)

{
  BigInt res;
  BigInt local_58;
  BigInt local_38;
  
  if (power == 0) {
    BigInt(__return_storage_ptr__,1);
  }
  else {
    quick_pow(&local_58,this,power / 2);
    if ((power & 1U) == 0) {
      multiply(__return_storage_ptr__,&local_58,&local_58);
    }
    else {
      multiply(&local_38,&local_58,&local_58);
      multiply(__return_storage_ptr__,&local_38,this);
      if (local_38.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_38.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (local_58.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_58.value.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BigInt BigInt::quick_pow(int power) {
    if (power == 0)
    {
        return BigInt(1);
    }
    BigInt res = quick_pow(power/2);
    if (power%2)
    {
        return res*res*(*this);
    }
    else
    {
        return res*res;
    }
}